

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O2

int jbcoin::compare<256ul,void>(base_uint<256UL,_void> *a,base_uint<256UL,_void> *b)

{
  uint uVar1;
  pair<const_unsigned_char_*,_const_unsigned_char_*> pVar2;
  
  pVar2 = std::
          __mismatch<unsigned_char_const*,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (a,a + 1,b);
  if ((base_uint<256UL,_void> *)pVar2.first == a + 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = (*pVar2.second < (byte)((base_uint<256UL,_void> *)pVar2.first)->pn[0]) - 1 | 1;
  }
  return uVar1;
}

Assistant:

inline int compare (
    base_uint<Bits, Tag> const& a, base_uint<Bits, Tag> const& b)
{
    auto ret = std::mismatch (a.cbegin (), a.cend (), b.cbegin ());

    if (ret.first == a.cend ())
        return 0;

    // a > b
    if (*ret.first > *ret.second)
        return 1;

    // a < b
    return -1;
}